

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

baseHolder * __thiscall cs_impl::any::holder<unsigned_long>::duplicate(holder<unsigned_long> *this)

{
  holder<unsigned_long> *phVar1;
  unsigned_long *in_stack_00000008;
  allocator_type<cs_impl::any::holder<unsigned_long>,_64UL,_cs_impl::default_allocator_provider>
  *in_stack_00000010;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<unsigned_long>,64ul,cs_impl::default_allocator_provider>
           ::alloc<unsigned_long&>(in_stack_00000010,in_stack_00000008);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}